

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O2

int alignSeq(string *a,string *b)

{
  char cVar1;
  char cVar2;
  int iVar3;
  value_type vVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  char *pcVar8;
  int i;
  size_type sVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  size_type __n;
  int iVar15;
  ulong uVar16;
  allocator_type local_8a;
  allocator_type local_89;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  m;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  sVar5 = a->_M_string_length;
  uVar10 = (int)b->_M_string_length + 1;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_48,(long)(int)uVar10,&local_89);
  uVar12 = (int)sVar5 + 1;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&m,(long)(int)uVar12,(value_type *)&local_48,&local_8a);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  sVar9 = 0;
  uVar11 = (ulong)uVar12;
  if ((int)uVar12 < 1) {
    uVar11 = sVar9;
  }
  for (; uVar11 != sVar9; sVar9 = sVar9 + 1) {
    pvVar6 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::at(&m,sVar9);
    pvVar7 = std::vector<int,_std::allocator<int>_>::at(pvVar6,0);
    *pvVar7 = 0;
  }
  uVar16 = 0;
  uVar11 = (ulong)uVar10;
  if ((int)uVar10 < 1) {
    uVar11 = uVar16;
  }
  for (sVar9 = 0; uVar11 != sVar9; sVar9 = sVar9 + 1) {
    pvVar6 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::at(&m,0);
    pvVar7 = std::vector<int,_std::allocator<int>_>::at(pvVar6,sVar9);
    *pvVar7 = (int)uVar16;
    uVar16 = (ulong)((int)uVar16 - 1);
  }
  iVar13 = 0;
  for (sVar9 = 1; (long)sVar9 < (long)(int)uVar12; sVar9 = sVar9 + 1) {
    for (__n = 1; (long)__n < (long)(int)uVar10; __n = __n + 1) {
      pcVar8 = (char *)std::__cxx11::string::at((ulong)a);
      cVar1 = *pcVar8;
      pcVar8 = (char *)std::__cxx11::string::at((ulong)b);
      cVar2 = *pcVar8;
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at(&m,sVar9 - 1);
      pvVar7 = std::vector<int,_std::allocator<int>_>::at(pvVar6,__n - 1);
      iVar15 = (uint)(cVar1 == cVar2) * 2 + -1 + *pvVar7;
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at(&m,sVar9 - 1);
      pvVar7 = std::vector<int,_std::allocator<int>_>::at(pvVar6,__n);
      iVar3 = *pvVar7;
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at(&m,sVar9);
      pvVar7 = std::vector<int,_std::allocator<int>_>::at(pvVar6,__n - 1);
      iVar14 = *pvVar7;
      if (*pvVar7 < iVar3) {
        iVar14 = iVar3;
      }
      vVar4 = iVar14 + -1;
      if (iVar14 + -1 < iVar15) {
        vVar4 = iVar15;
      }
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at(&m,sVar9);
      pvVar7 = std::vector<int,_std::allocator<int>_>::at(pvVar6,__n);
      *pvVar7 = vVar4;
      pvVar6 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::at(&m,sVar9);
      pvVar7 = std::vector<int,_std::allocator<int>_>::at(pvVar6,__n);
      if (iVar13 <= *pvVar7) {
        iVar13 = *pvVar7;
      }
    }
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&m);
  return iVar13;
}

Assistant:

int alignSeq(const std::string &a, const std::string &b)
{
	int rows = a.size() + 1;
	int cols = b.size() + 1;

	std::vector<std::vector<int>> m(rows, std::vector<int>(cols));
	int maxScore = 0;
	for (int i = 0; i < rows; ++i)
		m.at(i).at(0) = 0;
	for (int j = 0; j < cols; ++j)
		m.at(0).at(j) = j * GAP_PENALTY;
	for (int i = 1; i < rows; ++i)
	{
		for (int j = 1; j < cols; ++j)
		{
			int sim = a.at(i - 1) == b.at(j - 1) ? MATCH_SCORE : MIS_MATCH_SCORE;
			m.at(i).at(j) = std::max(sim + m.at(i - 1).at(j - 1),
									 std::max(GAP_PENALTY + m.at(i - 1).at(j), GAP_PENALTY + m.at(i).at(j - 1)));
			maxScore = std::max(maxScore, m.at(i).at(j));
		}
	}
	return maxScore;
}